

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cpp
# Opt level: O2

void __thiscall
icu_63::StringPiece::StringPiece(StringPiece *this,StringPiece *x,int32_t pos,int32_t len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = x->length_;
  iVar3 = pos;
  if (iVar1 < pos) {
    iVar3 = iVar1;
  }
  if (pos < 0) {
    iVar3 = 0;
  }
  iVar2 = iVar1 - iVar3;
  if (len <= iVar1 - iVar3) {
    iVar2 = len;
  }
  if (len < 0) {
    iVar2 = 0;
  }
  this->ptr_ = x->ptr_ + iVar3;
  this->length_ = iVar2;
  return;
}

Assistant:

StringPiece::StringPiece(const StringPiece& x, int32_t pos, int32_t len) {
  if (pos < 0) {
    pos = 0;
  } else if (pos > x.length_) {
    pos = x.length_;
  }
  if (len < 0) {
    len = 0;
  } else if (len > x.length_ - pos) {
    len = x.length_ - pos;
  }
  ptr_ = x.ptr_ + pos;
  length_ = len;
}